

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O3

void lts2::WaveletCoef_Biortho(string *name,double **P,double **Q,int *fsizeP,int *fsizeQ)

{
  char *__s1;
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  
  free(*P);
  free(*Q);
  __s1 = (name->_M_dataplus)._M_p;
  iVar1 = strcmp(__s1,"9-7");
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"9/7");
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"5-3");
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"5/3");
        if (iVar1 != 0) {
          pdVar3 = (double *)0x0;
          pdVar2 = (double *)0x0;
          goto LAB_0010fd8b;
        }
      }
      *fsizeP = 5;
      *fsizeQ = 3;
      pdVar2 = (double *)operator_new__(0x28);
      pdVar3 = (double *)operator_new__(0x18);
      pdVar2[4] = -0.17677669529663687;
      pdVar3[2] = 0.35355339059327373;
      *pdVar2 = -0.17677669529663687;
      pdVar2[1] = 0.35355339059327373;
      pdVar2[2] = 1.0606601717798212;
      pdVar2[3] = 0.35355339059327373;
      *pdVar3 = 0.35355339059327373;
      pdVar3[1] = 0.7071067811865475;
      goto LAB_0010fd8b;
    }
  }
  *fsizeP = 9;
  *fsizeQ = 7;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)*fsizeP) {
    uVar4 = (long)*fsizeP * 8;
  }
  pdVar2 = (double *)operator_new__(uVar4);
  pdVar3 = (double *)operator_new__(0x38);
  *pdVar2 = 0.02674875741081;
  pdVar2[1] = -0.01686411844287;
  pdVar2[2] = -0.07822326652899;
  pdVar2[3] = 0.26686411844287;
  pdVar2[4] = 0.60294901823636;
  pdVar2[5] = 0.26686411844287;
  pdVar2[6] = -0.07822326652899;
  pdVar2[7] = -0.01686411844287;
  pdVar2[8] = 0.02674875741081;
  *pdVar3 = 0.04563588155713;
  pdVar3[1] = -0.02877176311425;
  pdVar3[2] = -0.29563588155713;
  pdVar3[3] = 0.5575435262285;
  pdVar3[4] = -0.29563588155713;
  pdVar3[5] = -0.02877176311425;
  pdVar3[6] = 0.04563588155713;
LAB_0010fd8b:
  *P = pdVar2;
  *Q = pdVar3;
  return;
}

Assistant:

void lts2::WaveletCoef_Biortho(const std::string& name,double **P,double **Q,int *fsizeP, int *fsizeQ) {
	
  double *p = NULL;
  double *q = NULL;
  double sq;
	
  free(*P);
  free(*Q);
	
  if (!strcmp(name.c_str(),"9-7") || !strcmp(name.c_str(),"9/7")) {
    *fsizeP = 9;
    *fsizeQ = 7;
		
    p = new double[*fsizeP];
    q = new double[*fsizeQ];
		
    p[0] =   0.02674875741081;
    p[1] =  -0.01686411844287;
    p[2] =  -0.07822326652899;
    p[3] =   0.26686411844287;
    p[4] =   0.60294901823636;
    p[5] =   0.26686411844287;
    p[6] =  -0.07822326652899;
    p[7] =  -0.01686411844287;
    p[8] =   0.02674875741081;
		
    q[0] =   0.04563588155713;
    q[1] =  -0.02877176311425;
    q[2] =  -0.29563588155713;
    q[3] =   0.55754352622850;
    q[4] =  -0.29563588155713;
    q[5] =  -0.02877176311425;
    q[6] =   0.04563588155713;
		
    /*
      p[0] = 0.037828455506995; 
      p[1] = -0.023849465019380;
      p[2] = -0.11062440441842;
      p[3] = 0.37740285561265;
      p[4] = 0.85269867900940;
      p[5] = 0.37740285561265;
      p[6] = -0.11062440441842;
      p[7] = -0.023849465019380;
      p[8] = 0.037828455506995;
		 
      q[0] = -0.064538882628938;
      q[1] = -0.040689417609558;
      q[2] = 0.41809227322221;
      q[3] = 0.78848561640566;
      q[4] = 0.41809227322221;
      q[5] = -0.040689417609558;
      q[6] = -0.064538882628938;
    */
		
  } else if (!strcmp(name.c_str(),"5-3") || !strcmp(name.c_str(),"5/3")) {
    *fsizeP = 5;
    *fsizeQ = 3;
		
    p = new double[5];
    q = new double[3];
		
    sq = 2*sqrt(2);  
		
    p[0] = p[4] = -1/(2*sq);
    p[1] = p[3] = q[0] = q[2] = 1/sq;
    p[2] = 3/sq;
		
    q[1] = 2/sq;
  }
	
  *P = p;
  *Q = q;
	
  return;
}